

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

OptionAdder * __thiscall
cxxopts::OptionAdder::operator()
          (OptionAdder *this,string *opts,string *desc,shared_ptr<const_cxxopts::Value> *value,
          string *arg_help)

{
  Options *this_00;
  byte bVar1;
  ulong uVar2;
  invalid_option_format_error *piVar3;
  sub_match<const_char_*> *long_;
  sub_match<const_char_*> *short_;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  anon_class_1_0_00000001 local_e9;
  __shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2> local_e8;
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  string local_b0;
  string local_90;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  option_names;
  
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result._M_begin = (char *)0x0;
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.
  super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
            ((opts->_M_dataplus)._M_p,&result,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             (anonymous_namespace)::option_specifier_abi_cxx11_,0);
  lVar4 = (long)result.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)result.
                super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = lVar4 / 0x18;
  if (uVar2 < 4) {
    piVar3 = (invalid_option_format_error *)__cxa_allocate_exception(0x28,lVar4,lVar4 % 0x18);
    invalid_option_format_error::invalid_option_format_error(piVar3,opts);
    __cxa_throw(piVar3,&invalid_option_format_error::typeinfo,OptionException::~OptionException);
  }
  if ((result.
       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
       .
       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       result.
       super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
       .
       super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) || (0xfffffffffffffffc < uVar2 - 6)) {
    short_ = (sub_match<const_char_*> *)
             ((long)result.
                    super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar4 + -0x48);
LAB_0010e04d:
    long_ = (sub_match<const_char_*> *)
            ((long)result.
                   super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar4 + -0x48);
  }
  else {
    short_ = result.
             super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             .
             super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2;
    if (0xfffffffffffffffb < uVar2 - 7) goto LAB_0010e04d;
    long_ = result.
            super_vector<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 3;
  }
  bVar1 = short_->matched ^ 1U |
          (short_->super_pair<const_char_*,_const_char_*>).second ==
          (short_->super_pair<const_char_*,_const_char_*>).first;
  if (bVar1 == 0) {
    pcVar5 = (long_->super_pair<const_char_*,_const_char_*>).first;
    pcVar6 = (long_->super_pair<const_char_*,_const_char_*>).second;
LAB_0010e0a1:
    if (((bVar1 | ~long_->matched | (long)pcVar6 - (long)pcVar5 != 1) & 1) != 0) {
      operator()::anon_class_1_0_00000001::operator()(&option_names,&local_e9,short_,long_);
      this_00 = this->m_options;
      std::__cxx11::string::string((string *)&local_b0,(string *)desc);
      std::__shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_e8,
                 &value->super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>);
      std::__cxx11::string::string((string *)&local_90,(string *)arg_help);
      Options::add_option(this_00,&this->m_group,
                          &option_names.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                           ._M_head_impl,(string *)&option_names,&local_b0,
                          (shared_ptr<const_cxxopts::Value> *)&local_e8,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
      std::__cxx11::string::~string((string *)&local_b0);
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Tuple_impl(&option_names.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    );
      std::
      _Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
      ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<const_char_*>,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                       *)&result);
      return this;
    }
    piVar3 = (invalid_option_format_error *)__cxa_allocate_exception(0x28);
    invalid_option_format_error::invalid_option_format_error(piVar3,opts);
  }
  else {
    if ((long_->matched & 1U) != 0) {
      pcVar5 = (long_->super_pair<const_char_*,_const_char_*>).first;
      pcVar6 = (long_->super_pair<const_char_*,_const_char_*>).second;
      if (pcVar6 != pcVar5) goto LAB_0010e0a1;
    }
    piVar3 = (invalid_option_format_error *)__cxa_allocate_exception(0x28);
    invalid_option_format_error::invalid_option_format_error(piVar3,opts);
  }
  __cxa_throw(piVar3,&invalid_option_format_error::typeinfo,OptionException::~OptionException);
}

Assistant:

inline OptionAdder &OptionAdder::operator()(const std::string &opts,
                                            const std::string &desc,
                                            std::shared_ptr<const Value> value,
                                            std::string arg_help) {
  std::match_results<const char *> result;
  std::regex_match(opts.c_str(), result, option_specifier);

  if (result.empty()) {
    throw invalid_option_format_error(opts);
  }

  const auto &short_match = result[2];
  const auto &long_match = result[3];

  if (!short_match.length() && !long_match.length()) {
    throw invalid_option_format_error(opts);
  } else if (long_match.length() == 1 && short_match.length()) {
    throw invalid_option_format_error(opts);
  }

  auto option_names = [](const std::sub_match<const char *> &short_,
                         const std::sub_match<const char *> &long_) {
    if (long_.length() == 1) {
      return std::make_tuple(long_.str(), short_.str());
    } else {
      return std::make_tuple(short_.str(), long_.str());
    }
  }(short_match, long_match);

  m_options.add_option(m_group, std::get<0>(option_names),
                       std::get<1>(option_names), desc, value,
                       std::move(arg_help));

  return *this;
}